

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

void enet_peer_reset_outgoing_commands(ENetList *queue)

{
  ENetListIterator position;
  ENetPacket *packet;
  void *__ptr;
  
  while (position = (queue->sentinel).next, position != &queue->sentinel) {
    __ptr = enet_list_remove(position);
    packet = *(ENetPacket **)((long)__ptr + 0x60);
    if ((packet != (ENetPacket *)0x0) &&
       (packet->referenceCount = packet->referenceCount - 1, packet->referenceCount == 0)) {
      enet_packet_destroy(packet);
    }
    enet_free(__ptr);
  }
  return;
}

Assistant:

static void
enet_peer_reset_outgoing_commands (ENetList * queue)
{
    ENetOutgoingCommand * outgoingCommand;

    while (! enet_list_empty (queue))
    {
       outgoingCommand = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (queue));

       if (outgoingCommand -> packet != NULL)
       {
          -- outgoingCommand -> packet -> referenceCount;

          if (outgoingCommand -> packet -> referenceCount == 0)
            enet_packet_destroy (outgoingCommand -> packet);
       }

       enet_free (outgoingCommand);
    }
}